

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::EnumOneofFieldGenerator::GenerateSerializationCode
          (EnumOneofFieldGenerator *this,Printer *printer)

{
  string_view text;
  
  text._M_str = 
  "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.WriteEnum((int) $property_name$);\n}\n"
  ;
  text._M_len = 0x6c;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_PrimitiveOneofFieldGenerator).super_PrimitiveFieldGenerator.
                      super_FieldGeneratorBase.variables_,text);
  return;
}

Assistant:

void EnumOneofFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  output.WriteRawTag($tag_bytes$);\n"
    "  output.WriteEnum((int) $property_name$);\n"
    "}\n");
}